

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O2

bool __thiscall directed_graph_t::add_edge(directed_graph_t *this,vertex_index_t v,vertex_index_t w)

{
  pointer puVar1;
  ulong *puVar2;
  logic_error *this_00;
  ushort uVar3;
  ulong uVar4;
  ushort local_fc;
  ushort local_fa;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_f8;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  do {
    uVar3 = w;
    w = v;
    if (w <= uVar3) break;
    v = uVar3;
  } while (this->directed == false);
  local_fc = uVar3;
  local_fa = w;
  if ((w < this->number_of_vertices) && (uVar3 < this->number_of_vertices)) {
    uVar4 = 1L << ((byte)uVar3 & 0x3f) &
            (this->incidence_outgoing).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start
            [this->incidence_row_length * (ulong)w + (ulong)(uVar3 >> 6)];
    if (uVar4 == 0) {
      puVar1 = (this->outdegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + w;
      *puVar1 = *puVar1 + 1;
      puVar1 = (this->indegrees).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar3;
      *puVar1 = *puVar1 + 1;
      local_f8 = &this->edges;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(local_f8,&local_fa);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(local_f8,&local_fc);
      puVar2 = (this->incidence_outgoing).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start +
               this->incidence_row_length * (ulong)local_fa + (ulong)(uVar3 >> 6);
      *puVar2 = *puVar2 | 1L << ((byte)local_fc & 0x3f);
      puVar2 = (this->incidence_incoming).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start +
               this->incidence_row_length * (ulong)local_fc + (ulong)(w >> 6);
      *puVar2 = *puVar2 | 1L << ((byte)local_fa & 0x3f);
    }
    return uVar4 == 0;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  if (uVar3 < w) {
    uVar3 = w;
  }
  std::__cxx11::to_string(&local_d0,(uint)uVar3);
  std::operator+(&local_b0,"Out of bounds, tried to add an edge involving vertex ",&local_d0);
  std::operator+(&local_90,&local_b0,", but there are only ");
  std::__cxx11::to_string(&local_f0,(uint)this->number_of_vertices);
  std::operator+(&local_70,&local_90,&local_f0);
  std::operator+(&local_50,&local_70," vertices.");
  std::logic_error::logic_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool add_edge(vertex_index_t v, vertex_index_t w) {
		if (!directed && v > w) return add_edge(w, v);

		if (v >= number_of_vertices || w >= number_of_vertices)
			throw std::logic_error("Out of bounds, tried to add an edge involving vertex " +
			                       std::to_string(std::max(v, w)) + ", but there are only " +
			                       std::to_string(number_of_vertices) + " vertices.");

		const size_t vv = v >> 6;
		const size_t ww = w >> 6;

		// Prevent multiple insertions
		if (incidence_outgoing[v * incidence_row_length + ww] & (ONE_ << ((w - (ww << 6))))) return false;

		outdegrees[v]++;
		indegrees[w]++;
		edges.push_back(v);
		edges.push_back(w);

		incidence_outgoing[v * incidence_row_length + ww] |= ONE_ << ((w - (ww << 6)));

		incidence_incoming[w * incidence_row_length + vv] |= ONE_ << (v - (vv << 6));
		return true;
	}